

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.cpp
# Opt level: O0

size_t __thiscall CaDiCaL::Internal::flush_occs(Internal *this,int lit)

{
  bool bVar1;
  reference ppCVar2;
  reference ppCVar3;
  iterator __new_size;
  Clause *c;
  size_t res;
  const_occs_iterator i;
  occs_iterator j;
  const_occs_iterator end;
  Occs *os;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Internal *in_stack_ffffffffffffff80;
  Occs *__lhs;
  Clause *in_stack_ffffffffffffff88;
  Clause *local_70;
  __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  local_58;
  Clause **local_50;
  Clause *local_48;
  size_t local_40;
  __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  local_38;
  Clause **local_30;
  Clause **local_28;
  Occs *local_18;
  
  local_18 = occs(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  local_28 = (Clause **)
             std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::end
                       ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  __gnu_cxx::
  __normal_iterator<CaDiCaL::Clause*const*,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>
  ::__normal_iterator<CaDiCaL::Clause**>
            ((__normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
              *)in_stack_ffffffffffffff80,
             (__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
              *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_30 = (Clause **)
             std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin
                       ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                        CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  __gnu_cxx::
  __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
  ::__normal_iterator(&local_38);
  local_40 = 0;
  __gnu_cxx::
  __normal_iterator<CaDiCaL::Clause*const*,std::vector<CaDiCaL::Clause*,std::allocator<CaDiCaL::Clause*>>>
  ::__normal_iterator<CaDiCaL::Clause**>
            ((__normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
              *)in_stack_ffffffffffffff80,
             (__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
              *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_38._M_current = local_50;
  local_70 = in_stack_ffffffffffffff88;
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                             *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)), bVar1
        ) {
    ppCVar2 = __gnu_cxx::
              __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
              ::operator*(&local_38);
    local_48 = *ppCVar2;
    bVar1 = Clause::collect(local_48);
    if (!bVar1) {
      if ((*(uint *)&local_48->field_0x8 >> 9 & 1) == 0) {
        local_70 = local_48;
      }
      else {
        local_70 = (local_48->field_0).copy;
      }
      local_58 = __gnu_cxx::
                 __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                 ::operator++((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                               *)local_70,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
      ppCVar3 = __gnu_cxx::
                __normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                ::operator*(&local_58);
      *ppCVar3 = local_70;
      local_40 = local_40 + 1;
    }
    in_stack_ffffffffffffffa0 =
         __gnu_cxx::
         __normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
         ::operator++((__normal_iterator<CaDiCaL::Clause_*const_*,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                       *)local_70,(int)((ulong)in_stack_ffffffffffffff80 >> 0x20));
  }
  __lhs = local_18;
  __new_size = std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::begin
                         ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  __gnu_cxx::operator-
            ((__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
              *)__lhs,(__normal_iterator<CaDiCaL::Clause_**,_std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>_>
                       *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>::resize
            ((vector<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_> *)
             in_stack_ffffffffffffffa0._M_current,(size_type)__new_size._M_current);
  shrink_occs((Occs *)0xd679fc);
  return local_40;
}

Assistant:

size_t Internal::flush_occs (int lit) {
  Occs &os = occs (lit);
  const const_occs_iterator end = os.end ();
  occs_iterator j = os.begin ();
  const_occs_iterator i;
  size_t res = 0;
  Clause *c;
  for (i = j; i != end; i++) {
    c = *i;
    if (c->collect ())
      continue;
    *j++ = c->moved ? c->copy : c;
    assert (!c->redundant);
    res++;
  }
  os.resize (j - os.begin ());
  shrink_occs (os);
  return res;
}